

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::hash_set_cs_ext::intersect(hash_set *lhs,hash_set *rhs)

{
  reference args;
  proxy *in_RDI;
  iterator iVar1;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  hash_set *__range2;
  hash_set *s;
  var *ret;
  const_iterator *in_stack_ffffffffffffff28;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  any::
  make<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
            ();
  any::
  val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
            ((any *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  ::begin(in_stack_ffffffffffffff30);
  iVar1 = (iterator)
          phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ::end(in_stack_ffffffffffffff30);
  while (uVar2 = phmap::priv::operator!=
                           ((const_iterator *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28),
        (bool)uVar2) {
    args = phmap::priv::
           raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
           ::const_iterator::operator*((const_iterator *)0x24d2fc);
    in_stack_ffffffffffffff30 =
         (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          *)phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
            ::count<cs_impl::any>
                      ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                        *)iVar1.ctrl_,iVar1.field_1.slot_);
    if (in_stack_ffffffffffffff30 !=
        (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
         *)0x0) {
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::emplace<const_cs_impl::any_&,_0>
                ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                  *)CONCAT17(uVar2,in_stack_ffffffffffffff40),args);
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
    ::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff30);
  }
  return (var)in_RDI;
}

Assistant:

var intersect(const hash_set &lhs, const hash_set &rhs)
		{
			var ret = var::make<hash_set>();
			hash_set &s = ret.val<hash_set>();
			for (auto &it: lhs) {
				if (rhs.count(it) > 0)
					s.emplace(it);
			}
			return ret;
		}